

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O3

HttpContext<false> * uWS::HttpContext<false>::create(Loop *loop,us_socket_context_options_t options)

{
  int iVar1;
  HttpContext<false> *this;
  void *__s;
  undefined4 extraout_var;
  EVP_PKEY_CTX *ctx;
  
  this = (HttpContext<false> *)us_create_socket_context(0,loop,0xd90);
  if (this != (HttpContext<false> *)0x0) {
    __s = (void *)us_socket_context_ext(0);
    ctx = (EVP_PKEY_CTX *)0x0;
    memset(__s,0,0xd90);
    HttpRouter<uWS::HttpContextData<false>::RouterData>::HttpRouter
              ((HttpRouter<uWS::HttpContextData<false>::RouterData> *)((long)__s + 0x18));
    *(undefined8 *)((long)__s + 0xd80) = 0;
    iVar1 = init(this,ctx);
    return (HttpContext<false> *)CONCAT44(extraout_var,iVar1);
  }
  return (HttpContext<false> *)0x0;
}

Assistant:

static HttpContext *create(Loop *loop, us_socket_context_options_t options = {}) {
        HttpContext *httpContext;

        httpContext = (HttpContext *) us_create_socket_context(SSL, (us_loop_t *) loop, sizeof(HttpContextData<SSL>), options);

        if (!httpContext) {
            return nullptr;
        }

        /* Init socket context data */
        new ((HttpContextData<SSL> *) us_socket_context_ext(SSL, (us_socket_context_t *) httpContext)) HttpContextData<SSL>();
        return httpContext->init();
    }